

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.cpp
# Opt level: O1

Component __thiscall
ftxui::Input(ftxui *this,WideStringRef *content,ConstStringRef *placeholder,
            Ref<ftxui::InputOption> *option)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Component CVar1;
  undefined1 local_29;
  WideInputBase *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  local_28 = (WideInputBase *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<ftxui::WideInputBase,std::allocator<ftxui::WideInputBase>,ftxui::WideStringRef&,ftxui::ConstStringRef&,ftxui::Ref<ftxui::InputOption>&>
            (&local_20,&local_28,(allocator<ftxui::WideInputBase> *)&local_29,content,placeholder,
             option);
  *(WideInputBase **)this = local_28;
  *(undefined8 *)(this + 8) = 0;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = local_20._M_pi;
  CVar1.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  CVar1.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Component)CVar1.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Component Input(WideStringRef content,
                ConstStringRef placeholder,
                Ref<InputOption> option) {
  return Make<WideInputBase>(content, placeholder, std::move(option));
}